

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int send_disposition(LINK_INSTANCE *link_instance,delivery_number delivery_number,
                    AMQP_VALUE delivery_state)

{
  int iVar1;
  DISPOSITION_HANDLE disposition_00;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  DISPOSITION_HANDLE disposition;
  int result;
  AMQP_VALUE delivery_state_local;
  delivery_number delivery_number_local;
  LINK_INSTANCE *link_instance_local;
  
  disposition_00 = disposition_create((role)(link_instance->role & 1),delivery_number);
  if (disposition_00 == (DISPOSITION_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"send_disposition",0xa9,1,"NULL disposition performative");
    }
    disposition._4_4_ = 0xaa;
  }
  else {
    iVar1 = disposition_set_last(disposition_00,delivery_number);
    if (iVar1 == 0) {
      iVar1 = disposition_set_settled(disposition_00,true);
      if (iVar1 == 0) {
        if ((delivery_state == (AMQP_VALUE)0x0) ||
           (iVar1 = disposition_set_state(disposition_00,delivery_state), iVar1 == 0)) {
          iVar1 = session_send_disposition(link_instance->link_endpoint,disposition_00);
          if (iVar1 == 0) {
            disposition._4_4_ = 0;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                        ,"send_disposition",0xc1,1,"Sending disposition failed in session send");
            }
            disposition._4_4_ = 0xc2;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                      ,"send_disposition",0xba,1,"Failed setting state on disposition performative")
            ;
          }
          disposition._4_4_ = 0xbb;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                    ,"send_disposition",0xb5,1,"Failed setting settled on disposition performative")
          ;
        }
        disposition._4_4_ = 0xb6;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                  ,"send_disposition",0xb0,1,"Failed setting last on disposition performative");
      }
      disposition._4_4_ = 0xb1;
    }
    disposition_destroy(disposition_00);
  }
  return disposition._4_4_;
}

Assistant:

static int send_disposition(LINK_INSTANCE* link_instance, delivery_number delivery_number, AMQP_VALUE delivery_state)
{
    int result;

    DISPOSITION_HANDLE disposition = disposition_create(link_instance->role, delivery_number);
    if (disposition == NULL)
    {
        LogError("NULL disposition performative");
        result = MU_FAILURE;
    }
    else
    {
        if (disposition_set_last(disposition, delivery_number) != 0)
        {
            LogError("Failed setting last on disposition performative");
            result = MU_FAILURE;
        }
        else if (disposition_set_settled(disposition, true) != 0)
        {
            LogError("Failed setting settled on disposition performative");
            result = MU_FAILURE;
        }
        else if ((delivery_state != NULL) && (disposition_set_state(disposition, delivery_state) != 0))
        {
            LogError("Failed setting state on disposition performative");
            result = MU_FAILURE;
        }
        else
        {
            if (session_send_disposition(link_instance->link_endpoint, disposition) != 0)
            {
                LogError("Sending disposition failed in session send");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }

        disposition_destroy(disposition);
    }

    return result;
}